

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
          (XmlUnitTestResultPrinter *this,char *output_file)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  allocator local_19;
  char *local_18;
  char *output_file_local;
  XmlUnitTestResultPrinter *this_local;
  
  local_18 = output_file;
  output_file_local = (char *)this;
  EmptyTestEventListener::EmptyTestEventListener(&this->super_EmptyTestEventListener);
  pcVar1 = local_18;
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__XmlUnitTestResultPrinter_001a4460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->output_file_,pcVar1,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  lVar2 = std::__cxx11::string::c_str();
  if (lVar2 != 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      return;
    }
  }
  fprintf(_stderr,"XML output file may not be null\n");
  fflush(_stderr);
  exit(1);
}

Assistant:

XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.c_str() == NULL || output_file_.empty()) {
    fprintf(stderr, "XML output file may not be null\n");
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
}